

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O1

int parse_http_header(http_t *info)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  char *pcVar6;
  
  pcVar6 = info->buffer;
  fgets(pcVar6,0x2000,(FILE *)info->in);
  pcVar3 = strchr(pcVar6,0x20);
  if ((pcVar3 == (char *)0x0) || (pcVar4 = strcasestr(pcVar6,"HTTP"), pcVar4 == (char *)0x0)) {
    pcVar6 = "[%s][%s(%d)]:bad http head\n";
    uVar5 = 0xf9;
  }
  else {
    iVar1 = atoi(pcVar3 + 1);
    info->status_code = iVar1;
    pcVar3 = fgets(pcVar6,0x2000,(FILE *)info->in);
    if (pcVar3 != (char *)0x0) {
      do {
        iVar1 = strcmp(pcVar6,"\r\n");
        if (iVar1 == 0) {
          return 0;
        }
        pcVar3 = strncasestr(pcVar6,"Content-length");
        if (pcVar3 == (char *)0x0) {
          pcVar3 = strncasestr(pcVar6,"Transfer-Encoding");
          if (pcVar3 == (char *)0x0) {
            pcVar3 = strncasestr(pcVar6,"Location");
            if (pcVar3 == (char *)0x0) goto LAB_00104a6e;
            pcVar3 = strchr(pcVar3,0x3a);
            strncpy(info->location,pcVar3 + 2,0x7ff);
            pcVar4 = "[%s][%s(%d)]:Location: %s\n";
            uVar5 = 0x118;
            pcVar3 = info->location;
          }
          else {
            pcVar3 = strncasestr(pcVar6,"chunked");
            if (pcVar3 == (char *)0x0) {
              printf("[%s][%s(%d)]:Not support %s","MSG_ERROR","parse_http_header",0x110,pcVar6);
              return -1;
            }
            info->chunked_flag = 1;
            pcVar4 = "[%s][%s(%d)]:%s";
            uVar5 = 0x113;
            pcVar3 = pcVar6;
          }
          printf(pcVar4,"MSG_INFO","parse_http_header",uVar5,pcVar3);
        }
        else {
          pcVar3 = strchr(pcVar3,0x3a);
          uVar2 = atoi(pcVar3 + 2);
          info->len = uVar2;
          printf("[%s][%s(%d)]:Content-length: %d\n","MSG_INFO","parse_http_header",0x10a,
                 (ulong)uVar2);
        }
LAB_00104a6e:
        pcVar3 = fgets(pcVar6,0x2000,(FILE *)info->in);
      } while (pcVar3 != (char *)0x0);
    }
    pcVar6 = "[%s][%s(%d)]:bad http/https head\n";
    uVar5 = 0x11b;
  }
  printf(pcVar6,"MSG_ERROR","parse_http_header",uVar5);
  return -1;
}

Assistant:

int parse_http_header(http_t *info) {
  char *p = NULL;

  // resove first line
  fgets(info->buffer, RECV_BUF, info->in);
  p = strchr(info->buffer, ' ');
  // check http/https is legitimate
  if (!p || !strcasestr(info->buffer, "HTTP")) {
    lprintf(MSG_ERROR, "bad http head\n");
    return -1;
  }
  info->status_code = atoi(p + 1);
  lprintf(MSG_DEBUG, "http status code: %d\n", info->status_code);

  // Loop Read Resolve http Header
  while (fgets(info->buffer, RECV_BUF, info->in)) {
    // Judging whether the head has finished reading
    if (!strcmp(info->buffer, "\r\n")) return 0;

    lprintf(MSG_DEBUG, "%s", info->buffer);

    if ((p = strncasestr(info->buffer, (char *)"Content-length"))) {
      p = strchr(p, ':');
      p += 2;  // Skip the colon and the space behind it
      info->len = atoi(p);
      lprintf(MSG_INFO, "Content-length: %d\n", info->len);
    } else if ((p = strncasestr(info->buffer, (char *)"Transfer-Encoding"))) {
      if ((strncasestr(info->buffer, (char *)"chunked"))) {
        info->chunked_flag = 1;
      } else {
        // Unsupported Coding Transfer.
        lprintf(MSG_ERROR, "Not support %s", info->buffer);
        return -1;
      }
      lprintf(MSG_INFO, "%s", info->buffer);
    } else if ((p = strncasestr(info->buffer, (char *)"Location"))) {
      p = strchr(p, ':');
      p += 2;  // Skip the colon and the space behind it
      strncpy(info->location, p, URI_MAX_LEN - 1);
      lprintf(MSG_INFO, "Location: %s\n", info->location);
    }
  }
  lprintf(MSG_ERROR, "bad http/https head\n");
  return -1;
}